

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomizedRenderGrid::RandomizedRenderGrid
          (RandomizedRenderGrid *this,IVec2 *targetSize,IVec2 *cellSize,int maxCellCount,
          deUint32 seed)

{
  int iVar1;
  IVec2 extraSpace;
  Random rng;
  Vector<int,_2> local_68;
  Vector<int,_2> local_60;
  Vector<int,_2> local_58;
  Vector<int,_2> local_50;
  int local_48;
  int local_44;
  deRandom local_40;
  
  tcu::Vector<int,_2>::Vector(&this->m_targetSize,targetSize);
  tcu::Vector<int,_2>::Vector(&this->m_cellSize,cellSize);
  tcu::operator/((tcu *)&this->m_grid,targetSize,cellSize);
  this->m_currentCell = 0;
  iVar1 = (this->m_grid).m_data[1];
  iVar1 = (iVar1 - (uint)(1 < iVar1 && targetSize->m_data[1] % cellSize->m_data[1] == 0)) *
          (this->m_grid).m_data[0];
  if (maxCellCount < iVar1) {
    iVar1 = maxCellCount;
  }
  this->m_cellCount = iVar1;
  tcu::Vector<int,_2>::Vector(&local_68,targetSize);
  tcu::Vector<int,_2>::Vector(&local_58,cellSize);
  tcu::Vector<int,_2>::Vector(&local_60,&this->m_grid);
  iVar1 = this->m_cellCount;
  deRandom_init(&local_40,seed);
  tcu::operator*(&local_58,&local_60);
  tcu::operator-(&local_68,&local_50);
  local_44 = local_44 +
             ((local_60.m_data[1] - iVar1 / local_60.m_data[0]) + -1 +
             (uint)(iVar1 % local_60.m_data[0] == 0)) * local_58.m_data[1];
  iVar1 = de::Random::getInt((Random *)&local_40,0,local_48);
  (this->m_baseRandomOffset).m_data[0] = iVar1;
  iVar1 = de::Random::getInt((Random *)&local_40,0,local_44);
  (this->m_baseRandomOffset).m_data[1] = iVar1;
  return;
}

Assistant:

RandomizedRenderGrid::RandomizedRenderGrid (const IVec2& targetSize, const IVec2& cellSize, int maxCellCount, deUint32 seed)
	: m_targetSize			(targetSize)
	, m_cellSize			(cellSize)
	, m_grid				(targetSize / cellSize)
	, m_currentCell			(0)
	// If the grid exactly fits height, take one row for randomization.
	, m_cellCount			(deMin32(maxCellCount, ((targetSize.y() % cellSize.y()) == 0) && m_grid.y() > 1 ? m_grid.x() * (m_grid.y() - 1) :  m_grid.x() * m_grid.y()))
	, m_baseRandomOffset	(getRandomOffset(seed, targetSize, cellSize, m_grid, m_cellCount))
{
}